

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O0

ompt_interface_fn_t libomp_target_fn_lookup(char *s)

{
  int iVar1;
  char *in_RDI;
  ompt_callback_target_data_op_t local_8;
  
  iVar1 = strcmp(in_RDI,"ompt_set_frame_enter");
  if (iVar1 == 0) {
    local_8 = ompt_set_frame_enter;
  }
  else {
    iVar1 = strcmp(in_RDI,"ompt_get_task_data");
    if (iVar1 == 0) {
      local_8 = ompt_get_task_data;
    }
    else {
      iVar1 = strcmp(in_RDI,"ompt_callback_device_initialize");
      if (iVar1 == 0) {
        local_8 = (ompt_callback_target_data_op_t)
                  ompt_callbacks.ompt_callback_device_initialize_callback;
      }
      else {
        iVar1 = strcmp(in_RDI,"ompt_callback_device_finalize");
        if (iVar1 == 0) {
          local_8 = (ompt_callback_target_data_op_t)
                    ompt_callbacks.ompt_callback_device_finalize_callback;
        }
        else {
          iVar1 = strcmp(in_RDI,"ompt_callback_device_load");
          if (iVar1 == 0) {
            local_8 = (ompt_callback_target_data_op_t)
                      ompt_callbacks.ompt_callback_device_load_callback;
          }
          else {
            iVar1 = strcmp(in_RDI,"ompt_callback_device_unload");
            if (iVar1 == 0) {
              local_8 = (ompt_callback_target_data_op_t)
                        ompt_callbacks.ompt_callback_device_unload_callback;
            }
            else {
              iVar1 = strcmp(in_RDI,"ompt_callback_target");
              if (iVar1 == 0) {
                local_8 = (ompt_callback_target_data_op_t)
                          ompt_callbacks.ompt_callback_target_callback;
              }
              else {
                iVar1 = strcmp(in_RDI,"ompt_callback_target_map");
                if (iVar1 == 0) {
                  local_8 = (ompt_callback_target_data_op_t)
                            ompt_callbacks.ompt_callback_target_map_callback;
                }
                else {
                  iVar1 = strcmp(in_RDI,"ompt_callback_target_data_op");
                  if (iVar1 == 0) {
                    local_8 = ompt_callbacks.ompt_callback_target_data_op_callback;
                  }
                  else {
                    iVar1 = strcmp(in_RDI,"ompt_callback_target_submit");
                    if (iVar1 == 0) {
                      local_8 = (ompt_callback_target_data_op_t)
                                ompt_callbacks.ompt_callback_target_submit_callback;
                    }
                    else {
                      local_8 = (ompt_callback_target_data_op_t)0x0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (ompt_interface_fn_t)local_8;
}

Assistant:

static ompt_interface_fn_t libomp_target_fn_lookup(const char *s) {
  if (strcmp(s, "ompt_set_frame_enter") == 0) 
    return (ompt_interface_fn_t) ompt_set_frame_enter;

  if (strcmp(s, "ompt_get_task_data") == 0) 
    return (ompt_interface_fn_t) ompt_get_task_data;

#define ompt_interface_fn(fn) \
  if (strcmp(s, #fn) == 0) \
  return (ompt_interface_fn_t) ompt_callbacks.ompt_callback(fn);

  FOREACH_OMPT_TARGET_CALLBACK(ompt_interface_fn)

#undef ompt_interface_fn

  return (ompt_interface_fn_t) 0;
}